

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

stumpless_target * open_network_target(stumpless_target *target)

{
  network_target *pnVar1;
  network_target *result;
  stumpless_target *target_local;
  
  pnVar1 = open_private_network_target((network_target *)target->id);
  target_local = target;
  if (pnVar1 == (network_target *)0x0) {
    target_local = (stumpless_target *)0x0;
  }
  return target_local;
}

Assistant:

struct stumpless_target *
open_network_target( struct stumpless_target *target ) {
  const struct network_target *result;

  result = open_private_network_target( target->id );
  if( result ) {
    return target;

  } else {
    return NULL;

  }
}